

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_type_pattern(lysp_yang_ctx *ctx,lysp_restr **patterns)

{
  LY_ERR LVar1;
  lysp_restr *restr_00;
  char *pcVar2;
  ly_ctx *local_c8;
  ly_ctx *local_c0;
  ly_ctx *local_a8;
  ly_ctx *local_a0;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  ly_bool __loop_end;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  lysp_restr *restr;
  size_t sStack_40;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_restr **pplStack_20;
  LY_ERR ret;
  lysp_restr **patterns_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_20 = patterns;
  patterns_local = (lysp_restr **)ctx;
  if (*patterns == (lysp_restr *)0x0) {
    _ret___1 = (undefined8 *)malloc(0x48);
    if (_ret___1 == (undefined8 *)0x0) {
      if (patterns_local == (lysp_restr **)0x0) {
        local_90 = (ly_ctx *)0x0;
      }
      else {
        local_90 = (ly_ctx *)
                   ((&((patterns_local[7]->arg).mod)->mod)
                    [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1]->ctx->dict).hash_tab;
      }
      ly_log(local_90,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type_pattern");
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    (*patterns)[-1].exts = (lysp_ext_instance *)((long)&((*patterns)[-1].exts)->name + 1);
    _ret___1 = (undefined8 *)realloc(&(*patterns)[-1].exts,(long)(*patterns)[-1].exts * 0x40 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      (*pplStack_20)[-1].exts = (lysp_ext_instance *)((long)&(*pplStack_20)[-1].exts[-1].exts + 7);
      if (patterns_local == (lysp_restr **)0x0) {
        local_88 = (ly_ctx *)0x0;
      }
      else {
        local_88 = (ly_ctx *)
                   ((&((patterns_local[7]->arg).mod)->mod)
                    [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1]->ctx->dict).hash_tab;
      }
      ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type_pattern");
      return LY_EMEM;
    }
  }
  *pplStack_20 = (lysp_restr *)(_ret___1 + 1);
  restr_00 = *pplStack_20 + (long)((long)&(*pplStack_20)[-1].exts[-1].exts + 7);
  memset(restr_00,0,0x40);
  LVar1 = get_argument((lysp_yang_ctx *)patterns_local,Y_STR_ARG,&(restr_00->arg).flags,
                       (char **)&word_len,&word,&stack0xffffffffffffffc0);
  if (LVar1 != LY_SUCCESS) {
    return LVar1;
  }
  if (word == (char *)0x0) {
    word = (char *)malloc(sStack_40 + 2);
  }
  else {
    word_len = (size_t)ly_realloc(word,sStack_40 + 2);
    word = (char *)word_len;
  }
  if (word == (char *)0x0) {
    if (patterns_local == (lysp_restr **)0x0) {
      local_98 = (ly_ctx *)0x0;
    }
    else {
      local_98 = (ly_ctx *)
                 ((&((patterns_local[7]->arg).mod)->mod)
                  [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1]->ctx->dict).hash_tab;
    }
    ly_log(local_98,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_type_pattern");
    return LY_EMEM;
  }
  if (sStack_40 != 0) {
    memmove(word + 1,(void *)word_len,sStack_40);
  }
  *word = '\x06';
  word[sStack_40 + 1] = '\0';
  if (patterns_local == (lysp_restr **)0x0) {
    local_a0 = (ly_ctx *)0x0;
  }
  else {
    local_a0 = (ly_ctx *)
               ((&((patterns_local[7]->arg).mod)->mod)
                [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1]->ctx->dict).hash_tab;
  }
  LVar1 = lydict_insert_zc(local_a0,word,(char **)restr_00);
  if (LVar1 == LY_SUCCESS) {
    (restr_00->arg).mod =
         (lysp_module *)
         (&((patterns_local[7]->arg).mod)->mod)
         [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1];
    buf._4_4_ = get_keyword((lysp_yang_ctx *)patterns_local,(ly_stmt *)((long)&restr + 4),
                            (char **)&word_len,&stack0xffffffffffffffc0);
    if (buf._4_4_ != LY_SUCCESS) {
      return buf._4_4_;
    }
    if (restr._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
      ret___3._3_1_ = 1;
      LVar1 = LY_SUCCESS;
    }
    else {
      if (restr._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
        if (patterns_local == (lysp_restr **)0x0) {
          local_a8 = (ly_ctx *)0x0;
        }
        else {
          local_a8 = (ly_ctx *)
                     ((&((patterns_local[7]->arg).mod)->mod)
                      [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1]->ctx->dict).hash_tab;
        }
        pcVar2 = lyplg_ext_stmt2str(restr._4_4_);
        ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
        return LY_EVALID;
      }
      LVar1 = get_keyword((lysp_yang_ctx *)patterns_local,(ly_stmt *)((long)&restr + 4),
                          (char **)&word_len,&stack0xffffffffffffffc0);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      ret___3._3_1_ = restr._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
      LVar1 = LY_SUCCESS;
    }
    while( true ) {
      buf._4_4_ = LVar1;
      if ((bool)ret___3._3_1_) {
        return buf._4_4_;
      }
      if (restr._4_4_ == LY_STMT_DESCRIPTION) {
        LVar1 = parse_text_field((lysp_yang_ctx *)patterns_local,restr_00->dsc,LY_STMT_DESCRIPTION,0
                                 ,&restr_00->dsc,Y_STR_ARG,(uint16_t *)0x0,&restr_00->exts);
      }
      else if (restr._4_4_ == LY_STMT_ERROR_APP_TAG) {
        LVar1 = parse_text_field((lysp_yang_ctx *)patterns_local,restr_00,LY_STMT_ERROR_APP_TAG,0,
                                 &restr_00->eapptag,Y_STR_ARG,(uint16_t *)0x0,&restr_00->exts);
      }
      else if (restr._4_4_ == LY_STMT_ERROR_MESSAGE) {
        LVar1 = parse_text_field((lysp_yang_ctx *)patterns_local,restr_00,LY_STMT_ERROR_MESSAGE,0,
                                 &restr_00->emsg,Y_STR_ARG,(uint16_t *)0x0,&restr_00->exts);
      }
      else if (restr._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
        LVar1 = parse_ext((lysp_yang_ctx *)patterns_local,(char *)word_len,sStack_40,restr_00,
                          LY_STMT_PATTERN,0,&restr_00->exts);
      }
      else if (restr._4_4_ == LY_STMT_MODIFIER) {
        if ((&((patterns_local[7]->arg).mod)->mod)
            [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1]->implemented < 2) {
          if (patterns_local == (lysp_restr **)0x0) {
            local_c0 = (ly_ctx *)0x0;
          }
          else {
            local_c0 = (ly_ctx *)
                       ((&((patterns_local[7]->arg).mod)->mod)
                        [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1]->ctx->dict).hash_tab
            ;
          }
          ly_vlog(local_c0,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                  ,"modifier","pattern");
          return LY_EVALID;
        }
        LVar1 = parse_type_pattern_modifier((lysp_yang_ctx *)patterns_local,restr_00);
      }
      else {
        if (restr._4_4_ != LY_STMT_REFERENCE) {
          if (patterns_local == (lysp_restr **)0x0) {
            local_c8 = (ly_ctx *)0x0;
          }
          else {
            local_c8 = (ly_ctx *)
                       ((&((patterns_local[7]->arg).mod)->mod)
                        [*(int *)((long)&(patterns_local[7]->arg).str + 4) - 1]->ctx->dict).hash_tab
            ;
          }
          pcVar2 = lyplg_ext_stmt2str(restr._4_4_);
          ly_vlog(local_c8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,"pattern");
          return LY_EVALID;
        }
        LVar1 = parse_text_field((lysp_yang_ctx *)patterns_local,restr_00->ref,LY_STMT_REFERENCE,0,
                                 &restr_00->ref,Y_STR_ARG,(uint16_t *)0x0,&restr_00->exts);
      }
      if (LVar1 != LY_SUCCESS) break;
      buf._4_4_ = get_keyword((lysp_yang_ctx *)patterns_local,(ly_stmt *)((long)&restr + 4),
                              (char **)&word_len,&stack0xffffffffffffffc0);
      if (buf._4_4_ != LY_SUCCESS) {
        return buf._4_4_;
      }
      LVar1 = LY_SUCCESS;
      if (restr._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
        if ((restr_00->exts != (lysp_ext_instance *)0x0) &&
           (LVar1 = ly_set_add((ly_set *)&patterns_local[8]->dsc,restr_00->exts,'\x01',
                               (uint32_t *)0x0), LVar1 != LY_SUCCESS)) {
          return LVar1;
        }
        buf._4_4_ = LVar1;
        ret___3._3_1_ = true;
        LVar1 = buf._4_4_;
      }
    }
    return LVar1;
  }
  return LVar1;
}

Assistant:

static LY_ERR
parse_type_pattern(struct lysp_yang_ctx *ctx, struct lysp_restr **patterns)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_restr *restr;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *patterns, restr, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_STR_ARG, &restr->arg.flags, &word, &buf, &word_len));

    /* add special meaning first byte */
    if (buf) {
        buf = ly_realloc(buf, word_len + 2);
        word = buf;
    } else {
        buf = malloc(word_len + 2);
    }
    LY_CHECK_ERR_RET(!buf, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
    if (word_len) {
        memmove(buf + 1, word, word_len);
    }
    buf[0] = LYSP_RESTR_PATTERN_ACK; /* pattern's default regular-match flag */
    buf[word_len + 1] = '\0'; /* terminating NULL byte */
    LY_CHECK_RET(lydict_insert_zc(PARSER_CTX(ctx), buf, &restr->arg.str));
    restr->arg.mod = PARSER_CUR_PMOD(ctx);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, restr->dsc, LY_STMT_DESCRIPTION, 0, &restr->dsc, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, restr->ref, LY_STMT_REFERENCE, 0, &restr->ref, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_ERROR_APP_TAG:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_APP_TAG, 0, &restr->eapptag, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_ERROR_MESSAGE:
            LY_CHECK_RET(parse_text_field(ctx, restr, LY_STMT_ERROR_MESSAGE, 0, &restr->emsg, Y_STR_ARG, NULL, &restr->exts));
            break;
        case LY_STMT_MODIFIER:
            PARSER_CHECK_STMTVER2_RET(ctx, "modifier", "pattern");
            LY_CHECK_RET(parse_type_pattern_modifier(ctx, restr));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, restr, LY_STMT_PATTERN, 0, &restr->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "pattern");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, restr->exts, ret, cleanup);
    }

cleanup:
    return ret;
}